

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O0

int satoko_add_variable(solver_t *s,char sign)

{
  uint entry;
  uint var;
  char sign_local;
  solver_t *s_local;
  
  entry = vec_sdbl_size(s->activity);
  vec_wl_push(s->watches);
  vec_wl_push(s->watches);
  vec_sdbl_push_back(s->activity,0);
  vec_uint_push_back(s->levels,0);
  vec_char_push_back(s->assigns,'\x03');
  vec_char_push_back(s->polarity,sign);
  vec_uint_push_back(s->reasons,0xffffffff);
  vec_uint_push_back(s->stamps,0);
  vec_char_push_back(s->seen,'\0');
  heap_insert(s->var_order,entry);
  if (s->marks != (vec_char_t *)0x0) {
    vec_char_push_back(s->marks,'\0');
  }
  return entry;
}

Assistant:

int satoko_add_variable(solver_t *s, char sign)
{
    unsigned var = vec_act_size(s->activity);
    vec_wl_push(s->watches);
    vec_wl_push(s->watches);
    vec_act_push_back(s->activity, 0);
    vec_uint_push_back(s->levels, 0);
    vec_char_push_back(s->assigns, SATOKO_VAR_UNASSING);
    vec_char_push_back(s->polarity, sign);
    vec_uint_push_back(s->reasons, UNDEF);
    vec_uint_push_back(s->stamps, 0);
    vec_char_push_back(s->seen, 0);
    heap_insert(s->var_order, var);
    if (s->marks)
        vec_char_push_back(s->marks, 0);
    return var;
}